

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O1

SchnorrSignature *
cfd::core::SignCommon
          (SchnorrSignature *__return_storage_ptr__,ByteData256 *msg,Privkey *sk,
          secp256k1_nonce_function_hardened *nonce_fn,ByteData *ndata)

{
  _Alloc_hider msg32;
  SchnorrSignature *pSVar1;
  bool bVar2;
  int iVar3;
  secp256k1_context_struct *ctx;
  uchar *sig64;
  CfdException *pCVar4;
  value_type_conflict *__val;
  pointer ndata_00;
  secp256k1_nonce_function_hardened noncefp;
  vector<unsigned_char,_std::allocator<unsigned_char>_> raw_sig;
  secp256k1_keypair keypair;
  string local_e8;
  ByteData local_c8;
  SchnorrSignature *local_b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  secp256k1_keypair local_90;
  
  local_b0 = __return_storage_ptr__;
  ctx = wally_get_secp_context();
  Privkey::GetData(&local_c8,sk);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8,&local_c8);
  iVar3 = secp256k1_keypair_create(ctx,&local_90,(uchar *)local_e8._M_dataplus._M_p);
  if ((uchar *)local_e8._M_dataplus._M_p != (uchar *)0x0) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if (local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (iVar3 != 1) {
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"Could not create keypair.","");
    CfdException::CfdException(pCVar4,kCfdInternalError,&local_e8);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (nonce_fn == (secp256k1_nonce_function_hardened *)0x0) {
    noncefp = (secp256k1_nonce_function_hardened)0x0;
  }
  else {
    noncefp = *nonce_fn;
  }
  local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sig64 = (uchar *)operator_new(0x40);
  local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = sig64 + 0x40;
  sig64[0x30] = '\0';
  sig64[0x31] = '\0';
  sig64[0x32] = '\0';
  sig64[0x33] = '\0';
  sig64[0x34] = '\0';
  sig64[0x35] = '\0';
  sig64[0x36] = '\0';
  sig64[0x37] = '\0';
  sig64[0x38] = '\0';
  sig64[0x39] = '\0';
  sig64[0x3a] = '\0';
  sig64[0x3b] = '\0';
  sig64[0x3c] = '\0';
  sig64[0x3d] = '\0';
  sig64[0x3e] = '\0';
  sig64[0x3f] = '\0';
  sig64[0x20] = '\0';
  sig64[0x21] = '\0';
  sig64[0x22] = '\0';
  sig64[0x23] = '\0';
  sig64[0x24] = '\0';
  sig64[0x25] = '\0';
  sig64[0x26] = '\0';
  sig64[0x27] = '\0';
  sig64[0x28] = '\0';
  sig64[0x29] = '\0';
  sig64[0x2a] = '\0';
  sig64[0x2b] = '\0';
  sig64[0x2c] = '\0';
  sig64[0x2d] = '\0';
  sig64[0x2e] = '\0';
  sig64[0x2f] = '\0';
  sig64[0x10] = '\0';
  sig64[0x11] = '\0';
  sig64[0x12] = '\0';
  sig64[0x13] = '\0';
  sig64[0x14] = '\0';
  sig64[0x15] = '\0';
  sig64[0x16] = '\0';
  sig64[0x17] = '\0';
  sig64[0x18] = '\0';
  sig64[0x19] = '\0';
  sig64[0x1a] = '\0';
  sig64[0x1b] = '\0';
  sig64[0x1c] = '\0';
  sig64[0x1d] = '\0';
  sig64[0x1e] = '\0';
  sig64[0x1f] = '\0';
  sig64[0] = '\0';
  sig64[1] = '\0';
  sig64[2] = '\0';
  sig64[3] = '\0';
  sig64[4] = '\0';
  sig64[5] = '\0';
  sig64[6] = '\0';
  sig64[7] = '\0';
  sig64[8] = '\0';
  sig64[9] = '\0';
  sig64[10] = '\0';
  sig64[0xb] = '\0';
  sig64[0xc] = '\0';
  sig64[0xd] = '\0';
  sig64[0xe] = '\0';
  sig64[0xf] = '\0';
  local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = sig64;
  local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  ByteData256::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8,msg);
  msg32._M_p = local_e8._M_dataplus._M_p;
  bVar2 = ByteData::IsEmpty(ndata);
  if (bVar2) {
    ndata_00 = (pointer)0x0;
  }
  else {
    ByteData::GetBytes(&local_a8,ndata);
    ndata_00 = local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
  }
  iVar3 = secp256k1_schnorrsig_sign(ctx,sig64,(uchar *)msg32._M_p,&local_90,noncefp,ndata_00);
  if ((!bVar2) &&
     (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((uchar *)local_e8._M_dataplus._M_p != (uchar *)0x0) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if (iVar3 == 1) {
    ByteData::ByteData((ByteData *)&local_e8,&local_c8.data_);
    pSVar1 = local_b0;
    SchnorrSignature::SchnorrSignature(local_b0,(ByteData *)&local_e8);
    if ((uchar *)local_e8._M_dataplus._M_p != (uchar *)0x0) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if (local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_c8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return pSVar1;
  }
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,"Could not create Schnorr signature.","");
  CfdException::CfdException(pCVar4,kCfdInternalError,&local_e8);
  __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

SchnorrSignature SignCommon(
    const ByteData256 &msg, const Privkey &sk,
    const secp256k1_nonce_function_hardened *nonce_fn, const ByteData ndata) {
  auto ctx = wally_get_secp_context();
  secp256k1_keypair keypair;
  auto ret =
      secp256k1_keypair_create(ctx, &keypair, sk.GetData().GetBytes().data());

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not create keypair.");
  }

  secp256k1_nonce_function_hardened nfn =
      nonce_fn == nullptr ? nullptr : *nonce_fn;

  std::vector<uint8_t> raw_sig(SchnorrSignature::kSchnorrSignatureSize);

  ret = secp256k1_schnorrsig_sign(
      ctx, raw_sig.data(), msg.GetBytes().data(), &keypair, nfn,
      (ndata.IsEmpty()) ? nullptr : ndata.GetBytes().data());

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not create Schnorr signature.");
  }

  return SchnorrSignature(raw_sig);
}